

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

void __thiscall QScroller::~QScroller(QScroller *this)

{
  long lVar1;
  QScrollerPrivate *pQVar2;
  Type *this_00;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QScrollerPrivate *d;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>
  *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)in_RDI = &PTR_metaObject_00d36890;
  pQVar2 = d_func((QScroller *)0xa80b98);
  QGestureRecognizer::unregisterRecognizer((GestureType)((ulong)in_RDI >> 0x20));
  pQVar2->recognizer = (QFlickGestureRecognizer *)0x0;
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>::
            operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_allScrollers>_>
                        *)in_stack_ffffffffffffffc8);
  QMap<QObject_*,_QScroller_*>::remove(this_00,(char *)&pQVar2->target);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_activeScrollers>_>::
  operator()(in_stack_ffffffffffffffc8);
  QList<QScroller*>::removeOne<QScroller*>
            ((QList<QScroller_*> *)in_RDI,(QScroller **)in_stack_ffffffffffffffc8);
  if (*(long **)(in_RDI + 0x10) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x20))();
  }
  QObject::~QObject(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QScroller::~QScroller()
{
    Q_D(QScroller);
#ifndef QT_NO_GESTURES
    QGestureRecognizer::unregisterRecognizer(d->recognizerType);
    // do not delete the recognizer. The QGestureManager is doing this.
    d->recognizer = nullptr;
#endif
    qt_allScrollers()->remove(d->target);
    qt_activeScrollers()->removeOne(this);

    delete d_ptr;
}